

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void GenCodeCmdJmpnz(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint *puVar1;
  x86Command xVar2;
  x86Reg reg1;
  x86Instruction *pxVar3;
  x86Instruction *pxVar4;
  x86Command xVar5;
  x86Instruction *pxVar6;
  uint shift;
  
  shift = (uint)((ulong)cmd >> 0x15) & 0x7f8;
  reg1 = CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,shift,true);
  if (reg1 == rRegCount) {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,shift);
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    reg1 = rEAX;
  }
  else {
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    if ((ctx->ctx).x86LookBehind == true) {
      for (pxVar3 = (ctx->ctx).x86Op + -2;
          (xVar5 = pxVar3[2].name, xVar5 == o_other || (xVar5 == o_none)); pxVar3 = pxVar3 + -1) {
      }
      if (((xVar5 - o_setl < 8) && (pxVar3[2].argA.type == argReg)) &&
         (pxVar4 = pxVar3, pxVar3[2].argA.field_1.reg == reg1)) {
        for (; (xVar2 = pxVar4[1].name, xVar2 == o_none || (xVar2 == o_other)); pxVar4 = pxVar4 + -1
            ) {
        }
        pxVar6 = pxVar4;
        if (xVar2 == o_cmp) {
          for (; (xVar2 = pxVar6->name, xVar2 == o_none || (xVar2 == o_other)); pxVar6 = pxVar6 + -1
              ) {
          }
          if ((((xVar2 == o_xor) && ((pxVar6->argA).type == argReg)) &&
              ((pxVar6->argA).field_1.reg == reg1)) &&
             (((pxVar6->argB).type == argReg && ((pxVar6->argB).field_1.reg == reg1)))) {
            if (((pxVar4[1].argA.type != argReg) || (pxVar4[1].argA.field_1.reg != reg1)) &&
               ((pxVar4[1].argB.type != argReg || (pxVar4[1].argB.field_1.reg != reg1)))) {
              pxVar6->name = o_none;
            }
            pxVar3[2].name = o_none;
            puVar1 = &(ctx->ctx).optimizationCount;
            *puVar1 = *puVar1 + 1;
            xVar5 = GenCodeCmdJmpnz::jump[xVar5 - o_setl];
            goto LAB_001cd8aa;
          }
        }
      }
    }
  }
  EMIT_OP_REG_REG(&ctx->ctx,o_test,reg1,reg1);
  xVar5 = o_jne;
LAB_001cd8aa:
  EMIT_OP_LABEL(&ctx->ctx,xVar5,cmd.argument | 0xc0000000,1,1);
  return;
}

Assistant:

void GenCodeCmdJmpnz(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{

	x86Reg sourceReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, cmd.rC * 8, true);

	if(sourceReg == rRegCount)
	{
		sourceReg = rEAX;

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, sourceReg, sDWORD, rREG, cmd.rC * 8); // Load value

		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
		ctx.ctx.KillLateUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
	}
	else
	{
		ctx.ctx.KillEarlyUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);
		ctx.ctx.KillLateUnreadRegVmRegisters(ctx.exRegVmRegKillInfo + ctx.currInstructionRegKillOffset);

		if(ctx.ctx.x86LookBehind)
		{
			// Transform "xor, cmp, setcc, test, jz/jnz" into "cmp, jmpcc"
			x86Instruction *setInst = ctx.ctx.x86Op;

			while(setInst->name == o_none || setInst->name == o_other)
				setInst--;

			if((setInst->name >= o_setl && setInst->name <= o_setnz) && setInst->argA.type == x86Argument::argReg && setInst->argA.reg == sourceReg)
			{
				x86Command setCmd = setInst->name;

				x86Instruction *cmpInst = setInst - 1;

				while(cmpInst->name == o_none || cmpInst->name == o_other)
					cmpInst--;

				if(cmpInst->name == o_cmp)
				{
					x86Instruction *xorInst = cmpInst - 1;

					while(xorInst->name == o_none || xorInst->name == o_other)
						xorInst--;

					if(xorInst->name == o_xor && xorInst->argA.type == x86Argument::argReg && xorInst->argA.reg == sourceReg && xorInst->argB.type == x86Argument::argReg && xorInst->argB.reg == sourceReg)
					{
						// Keep xor if it's used by compare
						if(!((cmpInst->argA.type == x86Argument::argReg && cmpInst->argA.reg == sourceReg) || (cmpInst->argB.type == x86Argument::argReg && cmpInst->argB.reg == sourceReg)))
							xorInst->name = o_none;

						setInst->name = o_none;

						static const x86Command jump[] = { o_jl, o_jg, o_jle, o_jge, o_je, o_jne, o_jz, o_jnz };

						ctx.ctx.optimizationCount++;

						EMIT_OP_LABEL(ctx.ctx, jump[setCmd - o_setl], LABEL_GLOBAL | JUMP_NEAR | cmd.argument, true, true);
						return;
					}
				}
			}
		}
	}

	EMIT_OP_REG_REG(ctx.ctx, o_test, sourceReg, sourceReg);
	EMIT_OP_LABEL(ctx.ctx, o_jnz, LABEL_GLOBAL | JUMP_NEAR | cmd.argument, true, true);
}